

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Access64(int g_a,int64_t *lo,int64_t *hi,void *ptr,int64_t *ld)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_2;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer *in_stack_000002e0;
  void *in_stack_000002e8;
  Integer *in_stack_000002f0;
  Integer *in_stack_000002f8;
  Integer in_stack_00000300;
  int local_104;
  int local_100;
  int local_fc;
  undefined8 local_f8 [8];
  long local_b8 [8];
  long local_78 [8];
  long local_38;
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_30 = (long)in_EDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = pnga_ndim((Integer)hi);
  for (local_fc = 0; local_fc < local_38; local_fc = local_fc + 1) {
    local_78[(local_38 - local_fc) + -1] = *(long *)(local_10 + (long)local_fc * 8) + 1;
  }
  for (local_100 = 0; local_100 < local_38; local_100 = local_100 + 1) {
    local_b8[(local_38 - local_100) + -1] = *(long *)(local_18 + (long)local_100 * 8) + 1;
  }
  pnga_access_ptr(in_stack_00000300,in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,
                  in_stack_000002e0);
  for (local_104 = 0; (long)local_104 < local_38 + -1; local_104 = local_104 + 1) {
    *(undefined8 *)(local_28 + ((local_38 - local_104) + -2) * 8) = local_f8[local_104];
  }
  return;
}

Assistant:

void NGA_Access64(int g_a, int64_t lo[], int64_t hi[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     Integer _ga_work[MAXDIM];
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);

     wnga_access_ptr(a,_ga_lo, _ga_hi, ptr, _ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
}